

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O3

double __thiscall miniros::ROSOutAppender::log(ROSOutAppender *this,double __x)

{
  char *pcVar1;
  TopicManager *this_00;
  char *pcVar2;
  MasterLink *this_01;
  int iVar3;
  TimeBase<miniros::Time,_miniros::Duration> TVar4;
  char *in_RCX;
  char *in_RDX;
  _msg_type *p_Var5;
  uint in_ESI;
  char *in_R8;
  _line_type in_R9D;
  _file_type *p_Var6;
  _function_type *p_Var7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar9;
  LogPtr msg;
  MasterLinkPtr master;
  value_type local_88;
  _line_type local_74;
  char *local_70;
  MasterLink *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  char *local_58;
  string local_50;
  
  local_88.
  super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_70 = in_RDX;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<rosgraph_msgs::Log_<std::allocator<void>>,std::allocator<rosgraph_msgs::Log_<std::allocator<void>>>>
            (&local_88.
              super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(Log_<std::allocator<void>_> **)&local_88,
             (allocator<rosgraph_msgs::Log_<std::allocator<void>_>_> *)&local_50);
  TVar4 = (TimeBase<miniros::Time,_miniros::Duration>)Time::now();
  ((local_88.
    super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration> = TVar4;
  if (in_ESI < 5) {
    (local_88.
     super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->level = (_level_type)(0x1008040201 >> ((char)in_ESI * '\b' & 0x3fU));
  }
  local_74 = in_R9D;
  local_58 = in_R8;
  this_node::getName_abi_cxx11_();
  std::__cxx11::string::_M_assign
            ((string *)
             &(local_88.
               super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name);
  pcVar2 = local_70;
  pcVar1 = (char *)((local_88.
                     super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->msg)._M_string_length;
  p_Var5 = &(local_88.
             super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->msg;
  strlen(local_70);
  std::__cxx11::string::_M_replace((ulong)p_Var5,0,pcVar1,(ulong)pcVar2);
  pcVar1 = (char *)((local_88.
                     super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->file)._M_string_length;
  p_Var6 = &(local_88.
             super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->file;
  strlen(in_RCX);
  std::__cxx11::string::_M_replace((ulong)p_Var6,0,pcVar1,(ulong)in_RCX);
  pcVar1 = (char *)((local_88.
                     super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->function)._M_string_length;
  p_Var7 = &(local_88.
             super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->function;
  strlen(local_58);
  std::__cxx11::string::_M_replace((ulong)p_Var7,0,pcVar1,(ulong)local_58);
  (local_88.
   super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  )->line = local_74;
  this_00 = (this->topic_manager_).
            super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (TopicManager *)0x0) {
    local_68 = (MasterLink *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    TopicManager::getMasterLink(this_00);
    this_01 = local_68;
    if (local_68 != (MasterLink *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"/rosout_disable_topics_generation","");
      MasterLink::getCached(this_01,&local_50,&this->disable_topics_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (this->disable_topics_ == false) {
    this_node::getAdvertisedTopics
              (&(local_88.
                 super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->topics);
  }
  if (in_ESI - 3 < 2) {
    pcVar1 = (char *)(this->last_error_)._M_string_length;
    strlen(local_70);
    std::__cxx11::string::_M_replace((ulong)&this->last_error_,0,pcVar1,(ulong)local_70);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mutex_);
  if (iVar3 == 0) {
    std::
    vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
    ::push_back(&this->log_queue_,&local_88);
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
    uVar8 = extraout_XMM0_Da;
    uVar9 = extraout_XMM0_Db;
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      uVar8 = extraout_XMM0_Da_00;
      uVar9 = extraout_XMM0_Db_00;
    }
    if (local_88.
        super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.
                 super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      uVar8 = extraout_XMM0_Da_01;
      uVar9 = extraout_XMM0_Db_01;
    }
    return (double)CONCAT44(uVar9,uVar8);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void ROSOutAppender::log(::miniros::console::Level level, const char* str, const char* file, const char* function, int line)
{
  rosgraph_msgs::LogPtr msg(std::make_shared<rosgraph_msgs::Log>());

  msg->header.stamp = miniros::Time::now();
  if (level == miniros::console::Level::Debug)
  {
    msg->level = rosgraph_msgs::Log::DEBUG;
  }
  else if (level == miniros::console::Level::Info)
  {
    msg->level = rosgraph_msgs::Log::INFO;
  }
  else if (level == miniros::console::Level::Warn)
  {
    msg->level = rosgraph_msgs::Log::WARN;
  }
  else if (level == miniros::console::Level::Error)
  {
    msg->level = rosgraph_msgs::Log::ERROR;
  }
  else if (level == miniros::console::Level::Fatal)
  {
    msg->level = rosgraph_msgs::Log::FATAL;
  }
  msg->name = this_node::getName();
  msg->msg = str;
  msg->file = file;
  msg->function = function;
  msg->line = line;

  MasterLinkPtr master = topic_manager_ ? topic_manager_->getMasterLink() : MasterLinkPtr();
  // check parameter server/cache for omit_topics flag
  // the same parameter is checked in rosout.py for the same purpose
  if (master)
    master->getCached("/rosout_disable_topics_generation", disable_topics_);

  if (!disable_topics_) {
    this_node::getAdvertisedTopics(msg->topics);
  }

  if (level == ::miniros::console::Level::Fatal || level == ::miniros::console::Level::Error)
  {
    last_error_ = str;
  }

  std::scoped_lock<std::mutex> lock(queue_mutex_);
  log_queue_.push_back(msg);
  queue_condition_.notify_all();
}